

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkSets.c
# Opt level: O3

void Lpk_ComposeSets(Vec_Int_t *vSets0,Vec_Int_t *vSets1,int nVars,int iCofVar,Lpk_Set_t *pStore,
                    int *pSize,int nSizeLimit)

{
  Lpk_Set_t *pLVar1;
  ushort uVar2;
  int iVar3;
  int *piVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  uint *puVar8;
  long lVar9;
  uint uVar10;
  uint uVar11;
  long lVar12;
  byte bVar13;
  char cVar14;
  uint uVar15;
  long lVar16;
  char cVar17;
  uint uVar18;
  int iVar19;
  uint uVar20;
  uint uVar21;
  int iVar22;
  uint uVar23;
  uint local_80;
  
  iVar7 = Lpk_ComposeSets::nTravId;
  if (Lpk_ComposeSets::nTravId == 0x40000000) {
    memset(Lpk_ComposeSets::TravId,0,0x40000);
  }
  iVar5 = iVar7 + 1;
  Lpk_ComposeSets::nTravId = iVar5;
  if (0x20 < nVars) {
    __assert_fail("nBits <= 32",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kit.h"
                  ,0xe4,"unsigned int Kit_BitMask(int)");
  }
  iVar3 = vSets0->nSize;
  if (0 < (long)iVar3) {
    piVar4 = vSets0->pArray;
    uVar15 = vSets1->nSize;
    lVar9 = 0;
    local_80 = 0;
    do {
      if (0 < (int)uVar15) {
        uVar18 = piVar4[lVar9];
        puVar8 = (uint *)vSets1->pArray;
        uVar10 = uVar18 & 0xffff;
        uVar6 = uVar10 - (uVar18 >> 1 & 0x5555);
        uVar6 = (uVar6 >> 2 & 0x33333333) + (uVar6 & 0x33333333);
        lVar16 = 0;
        do {
          if (uVar10 != 0) {
            uVar20 = *puVar8 & 0xffff;
            if (((uVar20 != 0) &&
                (((uVar20 | uVar10) ^ (-1 << ((byte)nVars & 0x1f) | 1 << (iCofVar & 0x1fU))) !=
                 0xffffffff)) &&
               ((1 < ((uVar6 >> 4) + uVar6 & 0xf0f0f0f) * 0x1010101 >> 0x18 ||
                (uVar20 = uVar20 - (uVar20 >> 1 & 0x5555),
                uVar20 = (uVar20 >> 2 & 0x33333333) + (uVar20 & 0x33333333),
                1 < ((uVar20 >> 4) + uVar20 & 0xf0f0f0f) * 0x1010101 >> 0x18)))) {
              uVar20 = *puVar8 | uVar18;
              uVar11 = uVar20 >> 0x10 & uVar20;
              uVar21 = (uVar20 >> 1 & 0x5555) + (uVar20 & 0x5555);
              uVar23 = (uVar11 >> 1 & 0x5555) + (uVar11 & 0x5555);
              uVar11 = (uVar21 >> 2 & 0x3333) + (uVar21 & 0x3333);
              uVar21 = (uVar23 >> 2 & 0x3333) + (uVar23 & 0x3333);
              uVar11 = (uVar11 >> 4 & 0x707) + (uVar11 & 0x707);
              uVar21 = (uVar21 >> 4 & 0x707) + (uVar21 & 0x707);
              iVar22 = (uVar11 >> 8) + (uVar11 & 0xf);
              uVar21 = (uVar21 >> 8) + (uVar21 & 0xf);
              uVar11 = ~uVar21;
              iVar19 = iVar22 + uVar11;
              if (iVar19 != 0 && SCARRY4(iVar22,uVar11) == iVar19 < 0) {
                uVar11 = uVar20 & 0xffff;
                if (iVar7 < Lpk_ComposeSets::TravId[uVar11]) {
                  if ((Lpk_ComposeSets::TravId[uVar11] != iVar5) ||
                     (iVar19 <= Lpk_ComposeSets::SRed[uVar11])) goto LAB_004ee1a1;
                  Lpk_ComposeSets::TravId[uVar11] = iVar5;
                  Lpk_ComposeSets::SRed[uVar11] = (char)iVar19;
                }
                else {
                  lVar12 = (long)(int)local_80;
                  local_80 = local_80 + 1;
                  Lpk_ComposeSets::Used[lVar12] = (unsigned_short)uVar20;
                  Lpk_ComposeSets::TravId[uVar11] = iVar5;
                  Lpk_ComposeSets::SRed[uVar11] = (char)iVar19;
                }
                Lpk_ComposeSets::Over[uVar11] = (char)uVar21;
                Lpk_ComposeSets::Parents[uVar11] = (uint)lVar16 | (uint)lVar9;
              }
            }
          }
LAB_004ee1a1:
          lVar16 = lVar16 + 0x10000;
          puVar8 = puVar8 + 1;
        } while ((ulong)uVar15 << 0x10 != lVar16);
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 != iVar3);
    if (0 < (int)local_80) {
      iVar7 = 1000;
      lVar9 = 0;
      do {
        iVar5 = (int)Lpk_ComposeSets::Over[*(ushort *)((long)Lpk_ComposeSets::Used + lVar9)];
        if (iVar7 < Lpk_ComposeSets::Over[*(ushort *)((long)Lpk_ComposeSets::Used + lVar9)]) {
          iVar5 = iVar7;
        }
        iVar7 = iVar5;
        lVar9 = lVar9 + 2;
      } while ((ulong)local_80 * 2 != lVar9);
      if (0 < (int)local_80) {
        lVar9 = 0;
        do {
          uVar2 = *(ushort *)((long)Lpk_ComposeSets::Used + lVar9);
          if (iVar7 == Lpk_ComposeSets::Over[uVar2]) {
            iVar5 = *pSize;
            if (iVar5 == nSizeLimit) {
              return;
            }
            *pSize = iVar5 + 1;
            uVar15 = Lpk_ComposeSets::Parents[uVar2] & 0xffff;
            if (vSets0->nSize <= (int)uVar15) {
LAB_004ee368:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                            ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            pLVar1 = pStore + iVar5;
            uVar18 = Lpk_ComposeSets::Parents[uVar2] >> 0x10;
            uVar15 = vSets0->pArray[uVar15];
            pLVar1->uSubset0 = uVar15;
            if (vSets1->nSize <= (int)uVar18) goto LAB_004ee368;
            uVar18 = vSets1->pArray[uVar18];
            pLVar1->uSubset1 = uVar18;
            uVar15 = uVar15 | uVar18;
            pLVar1->iVar = (char)iCofVar;
            uVar18 = (uVar15 >> 1 & 0x5555) + (uVar15 & 0x5555);
            uVar18 = (uVar18 >> 2 & 0x3333) + (uVar18 & 0x3333);
            iVar5 = (uVar18 >> 4 & 0x707) + (uVar18 & 0x707);
            cVar17 = (char)((uint)iVar5 >> 8) + (char)iVar5;
            pLVar1->Size = cVar17;
            uVar15 = uVar15 >> 0x10 & uVar15;
            uVar15 = (uVar15 >> 1 & 0x5555) + (uVar15 & 0x5555);
            uVar15 = (uVar15 >> 2 & 0x3333) + (uVar15 & 0x3333);
            iVar5 = (uVar15 >> 4 & 0x707) + (uVar15 & 0x707);
            bVar13 = (char)((uint)iVar5 >> 8) + (char)iVar5;
            pLVar1->Over = bVar13;
            bVar13 = ~bVar13;
            cVar14 = bVar13 + cVar17;
            pLVar1->SRed = cVar14;
            if (cVar14 == '\0' || SCARRY1(bVar13,cVar17) != cVar14 < '\0') {
              __assert_fail("pEntry->SRed > 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/lpk/lpkSets.c"
                            ,0x11a,
                            "void Lpk_ComposeSets(Vec_Int_t *, Vec_Int_t *, int, int, Lpk_Set_t *, int *, int)"
                           );
            }
          }
          lVar9 = lVar9 + 2;
        } while ((ulong)local_80 * 2 != lVar9);
      }
    }
  }
  return;
}

Assistant:

void Lpk_ComposeSets( Vec_Int_t * vSets0, Vec_Int_t * vSets1, int nVars, int iCofVar,
    Lpk_Set_t * pStore, int * pSize, int nSizeLimit )
{
    static int nTravId = 0;            // the number of the times this is visited
    static int TravId[1<<16] = {0};    // last visited
    static char SRed[1<<16];           // best support reduction
    static char Over[1<<16];           // best overlaps
    static unsigned Parents[1<<16];    // best set of parents
    static unsigned short Used[1<<16]; // storage for used subsets
    int nSuppSize, nSuppOver, nSuppRed, nUsed, nMinOver, i, k, s;
    unsigned Entry, Entry0, Entry1;
    unsigned uSupp, uSupp0, uSupp1, uSuppTotal;
    Lpk_Set_t * pEntry;

    if ( nTravId == (1 << 30) )
        memset( TravId, 0, sizeof(int) * (1 << 16) );

    // collect support reducing subsets
    nUsed = 0;
    nTravId++;
    uSuppTotal = Kit_BitMask(nVars) & ~(1<<iCofVar);
    Vec_IntForEachEntry( vSets0, Entry0, i )
    Vec_IntForEachEntry( vSets1, Entry1, k )
    {
        uSupp0 = (Entry0 & 0xFFFF);
        uSupp1 = (Entry1 & 0xFFFF);
        // skip trivial
        if ( uSupp0 == 0 || uSupp1 == 0 || (uSupp0 | uSupp1) == uSuppTotal )
            continue;
        if ( Kit_WordHasOneBit(uSupp0) && Kit_WordHasOneBit(uSupp1) )
            continue;
        // get the entry
        Entry = Entry0 | Entry1;
        uSupp = Entry & 0xFFFF;
        // set the bound set size
        nSuppSize = Kit_WordCountOnes( uSupp );
        // get the number of overlapping vars
        nSuppOver = Kit_WordCountOnes( Entry & (Entry >> 16) );
        // get the support reduction
        nSuppRed  = nSuppSize - 1 - nSuppOver;
        // only consider support-reducing subsets
        if ( nSuppRed <= 0 )
            continue;
        // check if this support is already used
        if ( TravId[uSupp] < nTravId )
        {
            Used[nUsed++] = uSupp;

            TravId[uSupp] = nTravId;
            SRed[uSupp] = nSuppRed;
            Over[uSupp] = nSuppOver;
            Parents[uSupp] = (k << 16) | i;
        }
        else if ( TravId[uSupp] == nTravId && SRed[uSupp] < nSuppRed )
        {
            TravId[uSupp] = nTravId;
            SRed[uSupp] = nSuppRed;
            Over[uSupp] = nSuppOver;
            Parents[uSupp] = (k << 16) | i;
        }
    }

    // find the minimum overlap
    nMinOver = 1000;
    for ( s = 0; s < nUsed; s++ )
        if ( nMinOver > Over[Used[s]] )
            nMinOver = Over[Used[s]];


    // collect the accumulated ones
    for ( s = 0; s < nUsed; s++ )
        if ( Over[Used[s]] == nMinOver )
        {
            // save the entry
            if ( *pSize == nSizeLimit )
                return;
            pEntry = pStore + (*pSize)++;

            i = Parents[Used[s]] & 0xFFFF;
            k = Parents[Used[s]] >> 16;

            pEntry->uSubset0 = Vec_IntEntry(vSets0, i);
            pEntry->uSubset1 = Vec_IntEntry(vSets1, k);
            Entry  = pEntry->uSubset0 | pEntry->uSubset1;

            // record the cofactoring variable
            pEntry->iVar = iCofVar;
            // set the bound set size
            pEntry->Size = Kit_WordCountOnes( Entry & 0xFFFF );
            // get the number of overlapping vars
            pEntry->Over = Kit_WordCountOnes( Entry & (Entry >> 16) );
            // get the support reduction
            pEntry->SRed = pEntry->Size - 1 - pEntry->Over;
            assert( pEntry->SRed > 0 );
        }
}